

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O2

_Bool intersect_skewed_uint16_nonempty(uint16_t *small,size_t size_s,uint16_t *large,size_t size_l)

{
  ushort uVar1;
  long lVar2;
  int32_t iVar3;
  ushort *puVar4;
  uint16_t min;
  size_t sVar5;
  long lVar6;
  
  sVar5 = 0;
  if (size_s != 0) {
    min = *small;
    lVar6 = 0;
    puVar4 = large;
    while( true ) {
      uVar1 = *puVar4;
      while (min <= uVar1) {
        if (uVar1 <= min) {
          return uVar1 <= min;
        }
        if (size_s - 1 == lVar6) {
          return uVar1 <= min;
        }
        lVar2 = lVar6 + 1;
        lVar6 = lVar6 + 1;
        min = small[lVar2];
      }
      iVar3 = advanceUntil(large,(int32_t)sVar5,(int32_t)size_l,min);
      sVar5 = (size_t)iVar3;
      if (sVar5 == size_l) break;
      puVar4 = large + sVar5;
    }
  }
  return false;
}

Assistant:

bool intersect_skewed_uint16_nonempty(const uint16_t *small, size_t size_s,
                                      const uint16_t *large, size_t size_l) {
    size_t idx_l = 0, idx_s = 0;

    if (0 == size_s) {
        return false;
    }

    uint16_t val_l = large[idx_l], val_s = small[idx_s];

    while (true) {
        if (val_l < val_s) {
            idx_l = advanceUntil(large, (int32_t)idx_l, (int32_t)size_l, val_s);
            if (idx_l == size_l) break;
            val_l = large[idx_l];
        } else if (val_s < val_l) {
            idx_s++;
            if (idx_s == size_s) break;
            val_s = small[idx_s];
        } else {
            return true;
        }
    }

    return false;
}